

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * fts5ConfigGobbleWord(int *pRc,char *zIn,char **pzOut,int *pbQuoted)

{
  int iVar1;
  size_t sVar2;
  byte *z;
  long lVar3;
  
  sVar2 = strlen(zIn);
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    z = (byte *)sqlite3Malloc(sVar2 + 1);
    *pbQuoted = 0;
    *pzOut = (char *)0x0;
    if (z != (byte *)0x0) {
      memcpy(z,zIn,sVar2 + 1);
      if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
        iVar1 = fts5Dequote((char *)z);
        *pbQuoted = 1;
        if (zIn != (char *)0x0) {
          lVar3 = (long)iVar1;
LAB_001c70d5:
          *pzOut = (char *)z;
          return zIn + lVar3;
        }
      }
      else {
        lVar3 = 0;
        while (((long)zIn[lVar3] < 0 || ((&DAT_001e2c10)[zIn[lVar3]] != '\0'))) {
          lVar3 = lVar3 + 1;
        }
        if (lVar3 != 0) {
          z[lVar3] = 0;
          goto LAB_001c70d5;
        }
      }
      goto LAB_001c7053;
    }
  }
  else {
    *pbQuoted = 0;
    *pzOut = (char *)0x0;
  }
  *pRc = 7;
  z = (byte *)0x0;
LAB_001c7053:
  sqlite3_free(z);
  return (char *)0x0;
}

Assistant:

static const char *fts5ConfigGobbleWord(
  int *pRc,                       /* IN/OUT: Error code */
  const char *zIn,                /* Buffer to gobble string/bareword from */
  char **pzOut,                   /* OUT: malloc'd buffer containing str/bw */
  int *pbQuoted                   /* OUT: Set to true if dequoting required */
){
  const char *zRet = 0;

  sqlite3_int64 nIn = strlen(zIn);
  char *zOut = sqlite3_malloc64(nIn+1);

  assert( *pRc==SQLITE_OK );
  *pbQuoted = 0;
  *pzOut = 0;

  if( zOut==0 ){
    *pRc = SQLITE_NOMEM;
  }else{
    memcpy(zOut, zIn, (size_t)(nIn+1));
    if( fts5_isopenquote(zOut[0]) ){
      int ii = fts5Dequote(zOut);
      zRet = &zIn[ii];
      *pbQuoted = 1;
    }else{
      zRet = fts5ConfigSkipBareword(zIn);
      if( zRet ){
        zOut[zRet-zIn] = '\0';
      }
    }
  }

  if( zRet==0 ){
    sqlite3_free(zOut);
  }else{
    *pzOut = zOut;
  }

  return zRet;
}